

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_1aacf::IDLExportVisitor::visit_(IDLExportVisitor *this,Container *type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Typelib::Type_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,Typelib::Type_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Typelib::Type_const*>>>
  *this_00;
  bool bVar3;
  Type *pTVar4;
  ostream *poVar5;
  string element_name;
  string typedef_name;
  string target_namespace;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  Typelib::Type::getName_abi_cxx11_();
  bVar3 = std::operator==(&local_a8.first,"/std/string");
  std::__cxx11::string::~string((string *)&local_a8);
  if (!bVar3) {
    pTVar4 = (Type *)Typelib::Indirect::getIndirection();
    std::__cxx11::string::string((string *)&local_e8,"",(allocator *)&local_c8);
    getIDLBase(&local_a8,this,pTVar4,&local_e8);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    paVar1 = &local_a8.first.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8.first._M_dataplus._M_p == paVar1) {
      local_68.field_2._8_8_ = local_a8.first.field_2._8_8_;
    }
    else {
      local_68._M_dataplus._M_p = local_a8.first._M_dataplus._M_p;
    }
    local_68._M_string_length = local_a8.first._M_string_length;
    local_a8.first._M_string_length = 0;
    local_a8.first.field_2._M_allocated_capacity =
         local_a8.first.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_a8.first._M_dataplus._M_p = (pointer)paVar1;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_a8);
    std::__cxx11::string::~string((string *)&local_e8);
    if (local_68._M_string_length == 0) {
      std::__cxx11::string::string((string *)&local_e8,"/",(allocator *)&local_c8);
      getIDLAbsoluteNamespace(&local_a8.first,&local_e8,this->m_exporter);
      std::__cxx11::string::operator=((string *)&local_68,(string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_e8);
    }
    setTargetNamespace(this,&local_68);
    pTVar4 = (Type *)Typelib::Indirect::getIndirection();
    std::__cxx11::string::string((string *)&local_a8,"",(allocator *)&local_c8);
    getIDLAbsolute(&local_e8,this,pTVar4,&local_a8.first);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::string((string *)&local_108,"",(allocator *)&local_48);
    getIDLBase(&local_a8,this,(Type *)type,&local_108);
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    paVar2 = &local_a8.second.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8.second._M_dataplus._M_p == paVar2) {
      local_c8.field_2._8_8_ = local_a8.second.field_2._8_8_;
    }
    else {
      local_c8._M_dataplus._M_p = local_a8.second._M_dataplus._M_p;
    }
    local_c8._M_string_length = local_a8.second._M_string_length;
    local_a8.second._M_string_length = 0;
    local_a8.second.field_2._M_local_buf[0] = '\0';
    local_a8.second._M_dataplus._M_p = (pointer)paVar2;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_a8);
    std::__cxx11::string::~string((string *)&local_108);
    boost::algorithm::replace_all<std::__cxx11::string,char[3],char[2]>
              (&local_c8,(char (*) [3])"::",(char (*) [2])"_");
    poVar5 = std::operator<<((ostream *)&this->m_stream,(string *)&this->m_indent);
    poVar5 = std::operator<<(poVar5,"typedef sequence<");
    poVar5 = std::operator<<(poVar5,(string *)&local_e8);
    poVar5 = std::operator<<(poVar5,"> ");
    poVar5 = std::operator<<(poVar5,(string *)&local_c8);
    std::operator<<(poVar5,";\n");
    this_00 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Typelib::Type_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,Typelib::Type_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Typelib::Type_const*>>>
               *)this->m_exported_typedefs;
    Typelib::Indirect::getIndirection();
    Typelib::Type::getNamespace_abi_cxx11_();
    std::operator+(&local_108,&local_48,&local_c8);
    local_a8.first._M_string_length = local_108._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p == &local_108.field_2) {
      local_a8.first.field_2._8_8_ = local_108.field_2._8_8_;
      local_a8.first._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_a8.first._M_dataplus._M_p = local_108._M_dataplus._M_p;
    }
    local_108._M_string_length = 0;
    local_108.field_2._M_local_buf[0] = '\0';
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    local_a8.second._M_dataplus._M_p = (pointer)type;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Typelib::Type_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,Typelib::Type_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Typelib::Type_const*>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,Typelib::Container_const*>>
              (this_00,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Typelib::Container_*>
                        *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_68);
  }
  return true;
}

Assistant:

bool IDLExportVisitor::visit_(Container const& type)
    {
        if (type.getName() == "/std/string")
            return true;

        // sequence<> can be used as-is, but in order to be as cross-ORB
        // compatible as possible we generate sequence typedefs and use them in
        // the compounds. Emit the sequence right now.
        string target_namespace  = getIDLBase(type.getIndirection()).first;
        // We never emit sequences into the main namespace, even if their
        // element is a builtin
        if (target_namespace.empty())
            target_namespace = getIDLAbsoluteNamespace("/", m_exporter);
        setTargetNamespace(target_namespace);

        std::string element_name = getIDLAbsolute(type.getIndirection());
        std::string typedef_name = getIDLBase(type).second;
        boost::replace_all(typedef_name, "::", "_");
        m_stream << m_indent << "typedef sequence<" << element_name << "> " << typedef_name << ";\n";
        m_exported_typedefs.insert(make_pair(type.getIndirection().getNamespace() + typedef_name, &type));

        return true;
    }